

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quota.h
# Opt level: O2

ssize_t quota_release(quota *quota,size_t size)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  
  if (0x3fffffffbff < size) {
    __assert_fail("size < QUOTA_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                  ,0xa2,"ssize_t quota_release(struct quota *, size_t)");
  }
  if (size == 0) {
    __assert_fail("size_in_units",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                  ,0xa5,"ssize_t quota_release(struct quota *, size_t)");
  }
  do {
    uVar1 = quota->value;
    uVar3 = (uint)(size + 0x3ff >> 10);
    if ((uint)uVar1 < uVar3) {
      __assert_fail("size_in_units <= used_in_units",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                    ,0xab,"ssize_t quota_release(struct quota *, size_t)");
    }
    LOCK();
    uVar2 = quota->value;
    bVar4 = uVar1 == uVar2;
    if (bVar4) {
      quota->value = (ulong)((uint)uVar1 - uVar3) | uVar1 & 0xffffffff00000000;
      uVar2 = uVar1;
    }
    UNLOCK();
  } while (!bVar4);
  return uVar2;
}

Assistant:

static inline ssize_t
quota_release(struct quota *quota, size_t size)
{
	assert(size < QUOTA_MAX);
	uint32_t size_in_units = (size + (QUOTA_UNIT_SIZE - 1))
				  / QUOTA_UNIT_SIZE;
	assert(size_in_units);
	while (1) {
		uint64_t value = quota->value;
		uint32_t total_in_units = value >> 32;
		uint32_t used_in_units = value & UINT32_MAX;

		assert(size_in_units <= used_in_units);
		uint32_t new_used_in_units = used_in_units - size_in_units;

		uint64_t new_value =
			((uint64_t) total_in_units << 32) | new_used_in_units;

		if (pm_atomic_compare_exchange_weak(&quota->value, &value, new_value))
			break;
	}
	return size_in_units * QUOTA_UNIT_SIZE;
}